

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_parsenumber(SQRex *exp)

{
  char *pcVar1;
  int iVar2;
  long local_20;
  SQInteger positions;
  SQInteger ret;
  SQRex *exp_local;
  
  positions = (SQInteger)(*exp->_p + -0x30);
  local_20 = 10;
  exp->_p = exp->_p + 1;
  while( true ) {
    iVar2 = isdigit((int)*exp->_p);
    if (iVar2 == 0) break;
    pcVar1 = exp->_p;
    exp->_p = pcVar1 + 1;
    positions = positions * 10 + (long)(*pcVar1 + -0x30);
    if (local_20 == 1000000000) {
      sqstd_rex_error(exp,"overflow in numeric constant");
    }
    local_20 = local_20 * 10;
  }
  return positions;
}

Assistant:

static SQInteger sqstd_rex_parsenumber(SQRex *exp)
{
    SQInteger ret = *exp->_p-'0';
    SQInteger positions = 10;
    exp->_p++;
    while(isdigit(*exp->_p)) {
        ret = ret*10+(*exp->_p++-'0');
        if(positions==1000000000) sqstd_rex_error(exp,_SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}